

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CloseButton(ImGuiID id,ImVec2 *pos)

{
  bool bVar1;
  ImVec2 *in_RSI;
  float fVar2;
  ImU32 cross_col;
  float cross_extent;
  ImVec2 center;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  bool is_clipped;
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  float _x;
  ImVec2 *this;
  undefined8 in_stack_ffffffffffffff38;
  int num_segments;
  ImVec2 *lhs;
  undefined8 in_stack_ffffffffffffff40;
  ImVec2 *this_00;
  ImRect *in_stack_ffffffffffffff48;
  ImDrawList *pos_00;
  ImDrawList *in_stack_ffffffffffffff50;
  ImRect *in_stack_ffffffffffffff58;
  ImGuiButtonFlags flags;
  ImVec2 in_stack_ffffffffffffff70;
  bool *in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined1 local_70 [16];
  ImVec2 local_60;
  ImU32 local_58;
  byte local_54;
  byte local_52;
  byte local_51;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImRect local_30;
  ImGuiWindow *local_20;
  ImGuiContext *local_18;
  bool local_1;
  ImU32 col_00;
  
  num_segments = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_18 = GImGui;
  local_20 = GImGui->CurrentWindow;
  ImVec2::ImVec2(&local_48,GImGui->FontSize,GImGui->FontSize);
  local_40 = operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                       (ImVec2 *)0x1757c0);
  local_50 = operator*((ImVec2 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),0.0);
  local_38 = operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                       (ImVec2 *)0x175803);
  ImRect::ImRect(&local_30,in_RSI,&local_38);
  flags = (ImGuiButtonFlags)((ulong)in_RSI >> 0x20);
  bVar1 = ItemAdd(in_stack_ffffffffffffff58,(ImGuiID)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                  in_stack_ffffffffffffff48);
  local_51 = (bVar1 ^ 0xffU) & 1;
  local_54 = ButtonBehavior((ImRect *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                            (ImGuiID)in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                            (bool *)in_stack_ffffffffffffff70,flags);
  local_1 = (bool)local_54;
  if ((local_51 & 1) == 0) {
    local_58 = GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                           (float)in_stack_ffffffffffffff40);
    local_60 = ImRect::GetCenter((ImRect *)
                                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if ((local_52 & 1) != 0) {
      in_stack_ffffffffffffff50 = (ImDrawList *)local_70;
      ImVec2::ImVec2((ImVec2 *)in_stack_ffffffffffffff50,0.0,0.0);
      local_70._8_8_ =
           operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     (ImVec2 *)0x17590f);
      ImDrawList::AddCircleFilled
                (in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->Min,
                 (float)((ulong)in_stack_ffffffffffffff40 >> 0x20),(ImU32)in_stack_ffffffffffffff40,
                 num_segments);
    }
    _x = 0.5;
    fVar2 = local_18->FontSize * 0.5 * 0.7071 + -1.0;
    GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                (float)in_stack_ffffffffffffff40);
    this = (ImVec2 *)&stack0xffffffffffffff80;
    ImVec2::ImVec2(this,_x,_x);
    lhs = &local_60;
    operator-=(lhs,this);
    pos_00 = local_20->DrawList;
    this_00 = (ImVec2 *)&stack0xffffffffffffff70;
    ImVec2::ImVec2(this_00,-2.0,-fVar2);
    col_00 = (ImU32)((ulong)this_00 >> 0x20);
    operator+((ImVec2 *)CONCAT44(_x,in_stack_ffffffffffffff28),(ImVec2 *)0x175a02);
    ImDrawList::AddText(in_stack_ffffffffffffff50,(ImVec2 *)pos_00,col_00,(char *)lhs,(char *)this);
    local_1 = (bool)(local_54 & 1);
  }
  return local_1;
}

Assistant:

bool ImGui::CloseButton(ImGuiID id, const ImVec2& pos)//, float size)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We intentionally allow interaction when clipped so that a mechanical Alt,Right,Validate sequence close a window.
    // (this isn't the regular behavior of buttons, but it doesn't affect the user much because navigation tends to keep items visible).
    const ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    bool is_clipped = !ItemAdd(bb, id);

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);
    if (is_clipped)
        return pressed;

    // Render
    ImU32 col = GetColorU32(held ? ImGuiCol_ButtonActive : ImGuiCol_ButtonHovered);
    ImVec2 center = bb.GetCenter();
    if (hovered) {
        //window->DrawList->AddCircleFilled(center, ImMax(2.0f, g.FontSize * 0.5f + 1.0f), col, 12);
        window->DrawList->AddCircleFilled(center + ImVec2(0.0, 0), 0.1f, col, 12);
    }

    float cross_extent = g.FontSize * 0.5f * 0.7071f - 1.0f;
    ImU32 cross_col = GetColorU32(ImGuiCol_Text);
    center -= ImVec2(0.5f, 0.5f);
    window->DrawList->AddText(center + ImVec2(-2.0,-cross_extent), cross_col, "[X]");
    //window->DrawList->AddLine(center + ImVec2(+cross_extent,+cross_extent), center + ImVec2(-cross_extent,-cross_extent), cross_col, 1.0f);
    //window->DrawList->AddLine(center + ImVec2(+cross_extent,-cross_extent), center + ImVec2(-cross_extent,+cross_extent), cross_col, 1.0f);

    return pressed;
}